

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O3

int ncnn::binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx512_functor::binary_op_pow>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  int iVar7;
  long lVar8;
  float *pfVar9;
  undefined1 (*pauVar10) [32];
  undefined1 (*pauVar11) [32];
  uint uVar12;
  uint uVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  float fVar17;
  undefined1 auVar18 [32];
  __m512 afVar19;
  undefined1 auVar21 [56];
  undefined1 auVar20 [64];
  __m128 afVar22;
  binary_op_pow op;
  __m512 _p1;
  __m512 _p;
  binary_op_pow local_165;
  int local_164;
  void *local_160;
  ulong local_158;
  long local_150;
  long local_148;
  long local_140;
  void *local_138;
  Mat *local_130;
  Mat *local_128;
  Mat *local_120;
  ulong local_118;
  void *local_110;
  void *local_108;
  __m512 local_100;
  float local_c0 [2];
  float afStack_b8 [2];
  float afStack_b0 [2];
  float afStack_a8 [2];
  float afStack_a0 [2];
  float afStack_98 [2];
  float afStack_90 [2];
  float afStack_88 [22];
  
  iVar15 = a->h;
  local_158 = (ulong)(uint)a->c;
  iVar1 = a->w;
  iVar2 = a->d;
  iVar3 = a->elempack;
  local_128 = a;
  local_120 = b;
  Mat::create_like(c,a,(Allocator *)opt);
  iVar7 = -100;
  if ((c->data != (void *)0x0) && ((long)c->c * c->cstep != 0)) {
    if (0 < (int)local_158) {
      local_118 = 0;
      local_164 = iVar15 * iVar1 * iVar2 * iVar3;
      local_130 = c;
      do {
        pvVar4 = local_128->data;
        local_160 = (void *)local_128->elemsize;
        pvVar5 = local_120->data;
        pvVar6 = local_130->data;
        if (local_164 < 0x10) {
          pfVar9 = (float *)((long)pvVar4 + local_128->cstep * local_118 * (long)local_160);
          lVar16 = local_120->cstep * local_118 * local_120->elemsize;
          lVar14 = local_130->cstep * local_118 * local_130->elemsize;
          uVar13 = 0;
        }
        else {
          local_150 = local_130->cstep * local_130->elemsize * local_118;
          local_108 = (void *)(local_150 + (long)pvVar6);
          local_148 = local_120->cstep * local_120->elemsize * local_118;
          local_110 = (void *)((long)pvVar5 + local_148);
          local_140 = local_128->cstep * (long)local_160 * local_118;
          local_160 = (void *)((long)pvVar4 + local_140);
          lVar8 = 0;
          uVar12 = 0;
          local_138 = pvVar4;
          do {
            pfVar9 = (float *)((long)local_160 + lVar8);
            local_c0 = *(float (*) [2])pfVar9;
            afStack_b8 = *(float (*) [2])(pfVar9 + 2);
            afStack_b0 = *(float (*) [2])(pfVar9 + 4);
            afStack_a8 = *(float (*) [2])(pfVar9 + 6);
            afStack_a0 = *(float (*) [2])(pfVar9 + 8);
            afStack_98 = *(float (*) [2])(pfVar9 + 10);
            afStack_90 = *(float (*) [2])(pfVar9 + 0xc);
            afStack_88._0_8_ = *(undefined8 *)(pfVar9 + 0xe);
            afVar19 = *(__m512 *)((long)local_110 + lVar8);
            local_100 = afVar19;
            BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                      (&local_165,(__m512 *)local_c0,&local_100);
            *(__m512 *)((long)local_108 + lVar8) = afVar19;
            uVar13 = uVar12 + 0x10;
            iVar15 = uVar12 + 0x1f;
            lVar8 = lVar8 + 0x40;
            uVar12 = uVar13;
          } while (iVar15 < local_164);
          lVar14 = local_150 + lVar8;
          lVar16 = local_148 + lVar8;
          pfVar9 = (float *)((long)local_138 + local_140 + lVar8);
        }
        pauVar11 = (undefined1 (*) [32])((long)pvVar6 + lVar14);
        pauVar10 = (undefined1 (*) [32])((long)pvVar5 + lVar16);
        uVar12 = uVar13;
        if ((int)(uVar13 | 7) < local_164) {
          do {
            local_c0 = *(float (*) [2])pfVar9;
            afStack_b8 = *(float (*) [2])(pfVar9 + 2);
            afStack_b0 = *(float (*) [2])(pfVar9 + 4);
            afStack_a8 = *(float (*) [2])(pfVar9 + 6);
            auVar18 = *pauVar10;
            local_100[0] = (float)auVar18._0_4_;
            local_100[1] = (float)auVar18._4_4_;
            local_100[2] = (float)auVar18._8_4_;
            local_100[3] = (float)auVar18._12_4_;
            local_100[4] = (float)auVar18._16_4_;
            local_100[5] = (float)auVar18._20_4_;
            local_100[6] = (float)auVar18._24_4_;
            local_100[7] = (float)auVar18._28_4_;
            BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                      (&local_165,(__m256 *)local_c0,(__m256 *)local_100);
            *pauVar11 = auVar18;
            pfVar9 = pfVar9 + 8;
            pauVar10 = pauVar10 + 1;
            pauVar11 = pauVar11 + 1;
            uVar13 = uVar12 + 8;
            iVar15 = uVar12 + 0xf;
            uVar12 = uVar13;
          } while (iVar15 < local_164);
        }
        uVar12 = uVar13;
        if ((int)(uVar13 | 3) < local_164) {
          do {
            local_c0 = *(float (*) [2])pfVar9;
            afStack_b8 = *(float (*) [2])(pfVar9 + 2);
            local_100._0_16_ = *(undefined1 (*) [16])*pauVar10;
            auVar21 = ZEXT856(*(ulong *)(*pauVar10 + 8));
            afVar22 = BinaryOp_x86_avx512_functor::binary_op_pow::func_pack4
                                (&local_165,(__m128 *)local_c0,(__m128 *)local_100);
            auVar20._0_8_ = afVar22._0_8_;
            auVar20._8_56_ = auVar21;
            *(undefined1 (*) [16])*pauVar11 = auVar20._0_16_;
            pfVar9 = pfVar9 + 4;
            pauVar10 = (undefined1 (*) [32])(*pauVar10 + 0x10);
            pauVar11 = (undefined1 (*) [32])(*pauVar11 + 0x10);
            uVar13 = uVar12 + 4;
            iVar15 = uVar12 + 7;
            uVar12 = uVar13;
          } while (iVar15 < local_164);
        }
        iVar15 = local_164 - uVar13;
        if ((int)uVar13 < local_164) {
          lVar14 = 0;
          do {
            fVar17 = powf(pfVar9[lVar14],*(float *)(*pauVar10 + lVar14 * 4));
            *(float *)(*pauVar11 + lVar14 * 4) = fVar17;
            lVar14 = lVar14 + 1;
          } while (iVar15 != (int)lVar14);
        }
        local_118 = local_118 + 1;
      } while (local_118 != local_158);
    }
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

static int binary_op_7_13_19_29(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    // type 7 13 19 29
    c.create_like(a, opt.blob_allocator);
    if (c.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float* ptr1 = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _p1 = _mm512_loadu_ps(ptr1);
            __m512 _outp = op.func_pack16(_p, _p1);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _p1 = _mm256_loadu_ps(ptr1);
            __m256 _outp = op.func_pack8(_p, _p1);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _p1 = _mm_load_ps(ptr1);
            __m128 _outp = op.func_pack4(_p, _p1);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, *ptr1);
            ptr += 1;
            ptr1 += 1;
            outptr += 1;
        }
    }

    return 0;
}